

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O1

void __thiscall fineftp::FtpSession::handleFtpCommandNLST(FtpSession *this,string *param)

{
  pointer pcVar1;
  element_type *peVar2;
  bool bVar3;
  FileType FVar4;
  string local_path;
  FileStatus dir_status;
  undefined1 local_118 [48];
  string local_e8;
  FileStatus local_c8;
  
  peVar2 = (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_c8.path_._M_dataplus._M_p = (pointer)&local_c8.path_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Not logged in","");
    sendFtpMessage(this,NOT_LOGGED_IN,&local_c8.path_);
  }
  else {
    if ((peVar2->permissions_ & DirList) != None) {
      toLocalPath(&local_e8,this,param);
      Filesystem::FileStatus::FileStatus(&local_c8,(string *)&local_e8);
      bVar3 = Filesystem::FileStatus::isOk(&local_c8);
      if (bVar3) {
        FVar4 = Filesystem::FileStatus::type(&local_c8);
        if (FVar4 != Dir) {
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,"Path is not a directory","");
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_118);
          goto LAB_00118b5f;
        }
        bVar3 = Filesystem::FileStatus::canOpenDir(&local_c8);
        pcVar1 = local_118 + 0x10;
        local_118._0_8_ = pcVar1;
        if (!bVar3) {
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,"Permission denied","");
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_118);
          goto LAB_00118b5f;
        }
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"Sending name list","");
        sendFtpMessage(this,FILE_STATUS_OK_OPENING_DATA_CONNECTION,(string *)local_118);
        if ((pointer)local_118._0_8_ != pcVar1) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        Filesystem::dirContent
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                    *)local_118,(string *)&local_e8);
        sendNameList(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                           *)local_118);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                     *)local_118);
      }
      else {
        local_118._0_8_ = local_118 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"Path does not exist","");
        sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_118);
LAB_00118b5f:
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
      }
      Filesystem::FileStatus::~FileStatus(&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
        return;
      }
      goto LAB_00118b92;
    }
    local_c8.path_._M_dataplus._M_p = (pointer)&local_c8.path_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Permission denied","");
    sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,&local_c8.path_);
  }
  local_e8.field_2._M_allocated_capacity = local_c8.path_.field_2._M_allocated_capacity;
  local_e8._M_dataplus._M_p = local_c8.path_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.path_._M_dataplus._M_p == &local_c8.path_.field_2) {
    return;
  }
LAB_00118b92:
  operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void FtpSession::handleFtpCommandNLST(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }

    // RFC 959 does not allow ACTION_NOT_TAKEN (-> permanent error), so we return a temporary error (FILE_ACTION_NOT_TAKEN).
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    std::string local_path = toLocalPath(param);
    auto dir_status = Filesystem::FileStatus(local_path);

    if (dir_status.isOk())
    {
      if (dir_status.type() == Filesystem::FileType::Dir)
      {
        if (dir_status.canOpenDir())
        {
          sendFtpMessage(FtpReplyCode::FILE_STATUS_OK_OPENING_DATA_CONNECTION, "Sending name list");
          sendNameList(Filesystem::dirContent(local_path));
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
          return;
        }
      }
      else
      {
        // TODO: RFC959: If the pathname specifies a file then the server should send current information on the file.
        sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path is not a directory");
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path does not exist");
      return;
    }
  }